

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O2

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int _c;
  int i;
  ulong uVar7;
  float fVar8;
  Mat local_70;
  
  iVar3 = bottom_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    _c = bottom_blob->c;
    Mat::create(top_blob,iVar3,iVar4,_c,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar6 = iVar4 * iVar3;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = 0;
    }
    if (_c < 1) {
      _c = 0;
    }
    for (iVar3 = 0; iVar3 != _c; iVar3 = iVar3 + 1) {
      Mat::channel(&local_70,bottom_blob,iVar3);
      pvVar1 = local_70.data;
      Mat::~Mat(&local_70);
      Mat::channel(&local_70,top_blob,iVar3);
      pvVar2 = local_70.data;
      Mat::~Mat(&local_70);
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        fVar8 = roundf(this->scale * *(float *)((long)pvVar1 + uVar7 * 4));
        iVar4 = (int)fVar8;
        if (iVar4 < -0x7e) {
          iVar4 = -0x7f;
        }
        if (0x7e < iVar4) {
          iVar4 = 0x7f;
        }
        *(char *)((long)pvVar2 + uVar7) = (char)iVar4;
      }
    }
  }
  else if (iVar3 == 2) {
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    Mat::create(top_blob,iVar3,iVar4,1,opt->blob_allocator);
    pvVar1 = top_blob->data;
    if (pvVar1 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar6 = iVar4 * iVar3;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    pvVar2 = bottom_blob->data;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      fVar8 = roundf(this->scale * *(float *)((long)pvVar2 + uVar5 * 4));
      iVar3 = (int)fVar8;
      if (iVar3 < -0x7e) {
        iVar3 = -0x7f;
      }
      if (0x7e < iVar3) {
        iVar3 = 0x7f;
      }
      *(char *)((long)pvVar1 + uVar5) = (char)iVar3;
    }
  }
  else {
    if (iVar3 != 1) {
      return 0;
    }
    uVar6 = bottom_blob->w;
    Mat::create(top_blob,uVar6,1,opt->blob_allocator);
    pvVar1 = top_blob->data;
    if (pvVar1 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    pvVar2 = bottom_blob->data;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      fVar8 = roundf(this->scale * *(float *)((long)pvVar2 + uVar5 * 4));
      iVar3 = (int)fVar8;
      if (iVar3 < -0x7e) {
        iVar3 = -0x7f;
      }
      if (0x7e < iVar3) {
        iVar3 = 0x7f;
      }
      *(char *)((long)pvVar1 + uVar5) = (char)iVar3;
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}